

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::EnhancedLayouts::BufferTestBase::testCase(BufferTestBase *this,GLuint test_case_index)

{
  uint uVar1;
  TestContext *pTVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  ulong uVar5;
  bool bVar6;
  InvalidSourceException *exc;
  BuildException *exc_1;
  LogKernelSource local_6f8;
  LogKernelSource local_6d8;
  LogKernelSource local_6b8;
  LogKernelSource local_698;
  LogKernelSource local_678;
  LogKernelSource local_658;
  LogKernelSource local_638;
  LogKernelSource local_618;
  LogKernelSource local_5f8;
  byte local_5d5;
  uint local_5d4;
  undefined1 local_5d0 [3];
  bool result;
  LogKernelSource local_5b0;
  LogKernelSource local_590;
  LogKernelSource local_570;
  LogKernelSource local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  MessageBuilder local_4f0;
  stringstream local_370 [8];
  stringstream stream;
  allocator<char> local_1e1;
  string local_1e0;
  string local_1c0;
  string *local_1a0;
  string *vertex_shader;
  string *local_178;
  string *tess_eval_shader;
  string *local_150;
  string *tess_ctrl_shader;
  string *local_128;
  string *geometry_shader;
  string *local_100;
  string *fragment_shader;
  VertexArray vao;
  undefined1 local_d8 [8];
  Program program;
  Vector descriptors;
  NameVector captured_varyings;
  bufferCollection buffers;
  GLuint test_case_index_local;
  BufferTestBase *this_local;
  
  bufferCollection::bufferCollection
            ((bufferCollection *)
             &captured_varyings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&descriptors.
               super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::vector((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
            *)&program.m_context);
  Utils::Program::Program((Program *)local_d8,(this->super_TestBase).super_TestCase.m_context);
  Utils::VertexArray::VertexArray
            ((VertexArray *)&fragment_shader,(this->super_TestBase).super_TestCase.m_context);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xb])
            (this,(ulong)test_case_index,
             &descriptors.
              super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&geometry_shader,this,(ulong)test_case_index,5);
  local_100 = (string *)&geometry_shader;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&tess_ctrl_shader,this,(ulong)test_case_index,4);
  local_128 = (string *)&tess_ctrl_shader;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&tess_eval_shader,this,(ulong)test_case_index,2);
  local_150 = (string *)&tess_eval_shader;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&vertex_shader,this,(ulong)test_case_index,3);
  local_178 = (string *)&vertex_shader;
  (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xe])
            (&local_1c0,this,(ulong)test_case_index,1);
  local_1a0 = &local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"",&local_1e1);
  Utils::Program::Init
            ((Program *)local_d8,&local_1e0,local_100,local_128,local_150,local_178,local_1a0,
             (NameVector *)
             &descriptors.
              super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,true,false);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::stringstream::stringstream(local_370);
  uVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[0xf])
                    (this,(ulong)test_case_index,local_d8,local_370);
  uVar5 = (ulong)(uVar1 & 0xff) & 1;
  bVar6 = (int)uVar5 == 0;
  if (bVar6) {
    pTVar2 = deqp::Context::getTestContext((this->super_TestBase).super_TestCase.m_context);
    pTVar3 = tcu::TestContext::getLog(pTVar2);
    tcu::TestLog::operator<<(&local_4f0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_4f0,(char (*) [39])"Program inspection failed. Test case: ");
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_510,this,(ulong)test_case_index);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_510);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])". Reason: ");
    std::__cxx11::stringstream::str();
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_530);
    pTVar3 = tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::LogKernelSource::LogKernelSource(&local_550,local_1a0);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_550);
    tcu::LogKernelSource::LogKernelSource(&local_570,local_150);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_570);
    tcu::LogKernelSource::LogKernelSource(&local_590,local_178);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_590);
    tcu::LogKernelSource::LogKernelSource(&local_5b0,local_128);
    pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_5b0);
    tcu::LogKernelSource::LogKernelSource((LogKernelSource *)local_5d0,local_100);
    tcu::TestLog::operator<<(pTVar3,(KernelSource *)local_5d0);
    tcu::LogKernelSource::~LogKernelSource((LogKernelSource *)local_5d0);
    tcu::LogKernelSource::~LogKernelSource(&local_5b0);
    tcu::LogKernelSource::~LogKernelSource(&local_590);
    tcu::LogKernelSource::~LogKernelSource(&local_570);
    tcu::LogKernelSource::~LogKernelSource(&local_550);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_510);
    tcu::MessageBuilder::~MessageBuilder(&local_4f0);
    this_local._7_1_ = 0;
  }
  local_5d4 = (uint)bVar6;
  std::__cxx11::stringstream::~stringstream(local_370);
  if (local_5d4 == 0) {
    Utils::Program::Use((Program *)local_d8);
    (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[10])
              (this,(ulong)test_case_index,&program.m_context);
    cleanBuffers(this);
    prepareBuffers(this,(Vector *)&program.m_context,
                   (bufferCollection *)
                   &captured_varyings.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    Utils::VertexArray::Init((VertexArray *)&fragment_shader);
    Utils::VertexArray::Bind((VertexArray *)&fragment_shader);
    uVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[9])
                      (this,(ulong)((int)program.m_tess_ctrl.m_context != 0),(ulong)test_case_index,
                       CONCAT71((int7)(uVar5 >> 8),(int)program.m_tess_ctrl.m_context != 0));
    local_5d5 = (byte)uVar1 & 1;
    if ((uVar1 & 1) == 0) {
      pTVar2 = deqp::Context::getTestContext((this->super_TestBase).super_TestCase.m_context);
      pTVar3 = tcu::TestContext::getLog(pTVar2);
      tcu::LogKernelSource::LogKernelSource(&local_5f8,local_1a0);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_5f8);
      tcu::LogKernelSource::LogKernelSource(&local_618,local_150);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_618);
      tcu::LogKernelSource::LogKernelSource(&local_638,local_178);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_638);
      tcu::LogKernelSource::LogKernelSource(&local_658,local_128);
      pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_658);
      tcu::LogKernelSource::LogKernelSource(&local_678,local_100);
      tcu::TestLog::operator<<(pTVar3,&local_678);
      tcu::LogKernelSource::~LogKernelSource(&local_678);
      tcu::LogKernelSource::~LogKernelSource(&local_658);
      tcu::LogKernelSource::~LogKernelSource(&local_638);
      tcu::LogKernelSource::~LogKernelSource(&local_618);
      tcu::LogKernelSource::~LogKernelSource(&local_5f8);
      this_local._7_1_ = 0;
      local_5d4 = 1;
    }
    else {
      uVar1 = (*(this->super_TestBase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
                [0x10])(this,&captured_varyings.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if ((uVar1 & 1) == 0) {
        pTVar2 = deqp::Context::getTestContext((this->super_TestBase).super_TestCase.m_context);
        pTVar3 = tcu::TestContext::getLog(pTVar2);
        tcu::LogKernelSource::LogKernelSource(&local_698,local_1a0);
        pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_698);
        tcu::LogKernelSource::LogKernelSource(&local_6b8,local_150);
        pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_6b8);
        tcu::LogKernelSource::LogKernelSource(&local_6d8,local_178);
        pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_6d8);
        tcu::LogKernelSource::LogKernelSource(&local_6f8,local_128);
        pTVar3 = tcu::TestLog::operator<<(pTVar3,&local_6f8);
        tcu::LogKernelSource::LogKernelSource((LogKernelSource *)&exc_1,local_100);
        tcu::TestLog::operator<<(pTVar3,(KernelSource *)&exc_1);
        tcu::LogKernelSource::~LogKernelSource((LogKernelSource *)&exc_1);
        tcu::LogKernelSource::~LogKernelSource(&local_6f8);
        tcu::LogKernelSource::~LogKernelSource(&local_6d8);
        tcu::LogKernelSource::~LogKernelSource(&local_6b8);
        tcu::LogKernelSource::~LogKernelSource(&local_698);
        this_local._7_1_ = 0;
        local_5d4 = 1;
      }
      else {
        local_5d4 = 0;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&vertex_shader);
  std::__cxx11::string::~string((string *)&tess_eval_shader);
  std::__cxx11::string::~string((string *)&tess_ctrl_shader);
  std::__cxx11::string::~string((string *)&geometry_shader);
  Utils::VertexArray::~VertexArray((VertexArray *)&fragment_shader);
  Utils::Program::~Program((Program *)local_d8);
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::~vector((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
             *)&program.m_context);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&descriptors.
                super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bufferCollection::~bufferCollection
            ((bufferCollection *)
             &captured_varyings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_5d4 == 0) {
    this_local._7_1_ = 1;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BufferTestBase::testCase(GLuint test_case_index)
{
	try
	{
		bufferCollection		   buffers;
		Utils::Program::NameVector captured_varyings;
		bufferDescriptor::Vector   descriptors;
		Utils::Program			   program(m_context);
		Utils::VertexArray		   vao(m_context);

		/* Get captured varyings */
		getCapturedVaryings(test_case_index, captured_varyings);

		/* Get shader sources */
		const std::string& fragment_shader  = getShaderSource(test_case_index, Utils::Shader::FRAGMENT);
		const std::string& geometry_shader  = getShaderSource(test_case_index, Utils::Shader::GEOMETRY);
		const std::string& tess_ctrl_shader = getShaderSource(test_case_index, Utils::Shader::TESS_CTRL);
		const std::string& tess_eval_shader = getShaderSource(test_case_index, Utils::Shader::TESS_EVAL);
		const std::string& vertex_shader	= getShaderSource(test_case_index, Utils::Shader::VERTEX);

		/* Set up program */
		program.Init("" /* compute_shader */, fragment_shader, geometry_shader, tess_ctrl_shader, tess_eval_shader,
					 vertex_shader, captured_varyings, true, false /* is_separable */);

		/* Inspection */
		{
			std::stringstream stream;
			if (false == inspectProgram(test_case_index, program, stream))
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "Program inspection failed. Test case: " << getTestCaseName(test_case_index)
					<< ". Reason: " << stream.str() << tcu::TestLog::EndMessage
					<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
					<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
					<< tcu::TestLog::KernelSource(fragment_shader);

				return false;
			}
		}

		program.Use();

		/* Set up buffers */
		getBufferDescriptors(test_case_index, descriptors);
		cleanBuffers();
		prepareBuffers(descriptors, buffers);

		/* Set up vao */
		vao.Init();
		vao.Bind();

		/* Draw */
		bool result = executeDrawCall((program.m_tess_eval.m_id != 0), test_case_index);

#if USE_NSIGHT
		m_context.getRenderContext().postIterate();
#endif

		if (false == result)
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
				<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
				<< tcu::TestLog::KernelSource(fragment_shader);

			return false;
		}

		/* Verify result */
		if (false == verifyBuffers(buffers))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::KernelSource(vertex_shader) << tcu::TestLog::KernelSource(tess_ctrl_shader)
				<< tcu::TestLog::KernelSource(tess_eval_shader) << tcu::TestLog::KernelSource(geometry_shader)
				<< tcu::TestLog::KernelSource(fragment_shader);

			return false;
		}
	}
	catch (Utils::Shader::InvalidSourceException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}
	catch (Utils::Program::BuildException& exc)
	{
		exc.log(m_context);
		TCU_FAIL(exc.what());
	}

	/* Done */
	return true;
}